

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# caffe.pb.cc
# Opt level: O0

uint8 * __thiscall
caffe::SolverParameter::InternalSerializeWithCachedSizesToArray
          (SolverParameter *this,bool deterministic,uint8 *target)

{
  uint uVar1;
  bool bVar2;
  int iVar3;
  int size;
  int32 iVar4;
  SolverParameter_SolverMode value;
  uint uVar5;
  SolverParameter_SolverType value_00;
  SolverParameter_SnapshotFormat value_01;
  char *pcVar6;
  string *psVar7;
  int64 value_02;
  NetParameter *value_03;
  NetState *value_04;
  UnknownFieldSet *unknown_fields;
  float fVar8;
  double extraout_XMM0_Qa;
  double extraout_XMM0_Qa_00;
  double extraout_XMM0_Qa_01;
  double extraout_XMM0_Qa_02;
  double extraout_XMM0_Qa_03;
  double extraout_XMM0_Qa_04;
  double dVar9;
  uint local_78;
  uint n_2;
  uint i_2;
  uint n_1;
  uint i_1;
  int n;
  int i;
  uint32 cached_has_bits;
  uint8 *target_local;
  bool deterministic_local;
  SolverParameter *this_local;
  
  uVar1 = (this->_has_bits_).has_bits_[0];
  _i = target;
  if ((uVar1 & 1) != 0) {
    train_net_abi_cxx11_(this);
    pcVar6 = (char *)std::__cxx11::string::data();
    train_net_abi_cxx11_(this);
    iVar3 = std::__cxx11::string::length();
    google::protobuf::internal::WireFormat::VerifyUTF8StringNamedField
              (pcVar6,iVar3,SERIALIZE,"caffe.SolverParameter.train_net");
    psVar7 = train_net_abi_cxx11_(this);
    _i = google::protobuf::internal::WireFormatLite::WriteStringToArray(1,psVar7,target);
  }
  i_1 = 0;
  iVar3 = test_net_size(this);
  for (; (int)i_1 < iVar3; i_1 = i_1 + 1) {
    test_net_abi_cxx11_(this,i_1);
    pcVar6 = (char *)std::__cxx11::string::data();
    test_net_abi_cxx11_(this,i_1);
    size = std::__cxx11::string::length();
    google::protobuf::internal::WireFormat::VerifyUTF8StringNamedField
              (pcVar6,size,SERIALIZE,"caffe.SolverParameter.test_net");
    psVar7 = test_net_abi_cxx11_(this,i_1);
    _i = google::protobuf::internal::WireFormatLite::WriteStringToArray(2,psVar7,_i);
  }
  _i = google::protobuf::internal::WireFormatLite::WriteInt32ToArray(3,&this->test_iter_,_i);
  dVar9 = extraout_XMM0_Qa;
  if ((uVar1 & 0x200) != 0) {
    iVar4 = test_interval(this);
    _i = google::protobuf::internal::WireFormatLite::WriteInt32ToArray(4,iVar4,_i);
    dVar9 = extraout_XMM0_Qa_00;
  }
  if ((uVar1 & 0x400) != 0) {
    fVar8 = base_lr(this);
    _i = google::protobuf::internal::WireFormatLite::WriteFloatToArray(5,fVar8,_i);
    dVar9 = extraout_XMM0_Qa_01;
  }
  if ((uVar1 & 0x800) != 0) {
    iVar4 = display(this);
    _i = google::protobuf::internal::WireFormatLite::WriteInt32ToArray(6,iVar4,_i);
    dVar9 = extraout_XMM0_Qa_02;
  }
  if ((uVar1 & 0x1000) != 0) {
    iVar4 = max_iter(this);
    _i = google::protobuf::internal::WireFormatLite::WriteInt32ToArray(7,iVar4,_i);
    dVar9 = extraout_XMM0_Qa_03;
  }
  if ((uVar1 & 2) != 0) {
    lr_policy_abi_cxx11_(this);
    pcVar6 = (char *)std::__cxx11::string::data();
    lr_policy_abi_cxx11_(this);
    iVar3 = std::__cxx11::string::length();
    google::protobuf::internal::WireFormat::VerifyUTF8StringNamedField
              (pcVar6,iVar3,SERIALIZE,"caffe.SolverParameter.lr_policy");
    psVar7 = lr_policy_abi_cxx11_(this);
    _i = google::protobuf::internal::WireFormatLite::WriteStringToArray(8,psVar7,_i);
    dVar9 = extraout_XMM0_Qa_04;
  }
  if ((uVar1 & 0x2000) != 0) {
    dVar9 = gamma(this,dVar9);
    _i = google::protobuf::internal::WireFormatLite::WriteFloatToArray(9,SUB84(dVar9,0),_i);
  }
  if ((uVar1 & 0x4000) != 0) {
    fVar8 = power(this);
    _i = google::protobuf::internal::WireFormatLite::WriteFloatToArray(10,fVar8,_i);
  }
  if ((uVar1 & 0x8000) != 0) {
    fVar8 = momentum(this);
    _i = google::protobuf::internal::WireFormatLite::WriteFloatToArray(0xb,fVar8,_i);
  }
  if ((uVar1 & 0x10000) != 0) {
    fVar8 = weight_decay(this);
    _i = google::protobuf::internal::WireFormatLite::WriteFloatToArray(0xc,fVar8,_i);
  }
  if ((uVar1 & 0x20000) != 0) {
    iVar4 = stepsize(this);
    _i = google::protobuf::internal::WireFormatLite::WriteInt32ToArray(0xd,iVar4,_i);
  }
  if ((uVar1 & 0x40000) != 0) {
    iVar4 = snapshot(this);
    _i = google::protobuf::internal::WireFormatLite::WriteInt32ToArray(0xe,iVar4,_i);
  }
  if ((uVar1 & 4) != 0) {
    snapshot_prefix_abi_cxx11_(this);
    pcVar6 = (char *)std::__cxx11::string::data();
    snapshot_prefix_abi_cxx11_(this);
    iVar3 = std::__cxx11::string::length();
    google::protobuf::internal::WireFormat::VerifyUTF8StringNamedField
              (pcVar6,iVar3,SERIALIZE,"caffe.SolverParameter.snapshot_prefix");
    psVar7 = snapshot_prefix_abi_cxx11_(this);
    _i = google::protobuf::internal::WireFormatLite::WriteStringToArray(0xf,psVar7,_i);
  }
  if ((uVar1 & 0x200000) != 0) {
    bVar2 = snapshot_diff(this);
    _i = google::protobuf::internal::WireFormatLite::WriteBoolToArray(0x10,bVar2,_i);
  }
  if ((uVar1 & 0x4000000) != 0) {
    value = solver_mode(this);
    _i = google::protobuf::internal::WireFormatLite::WriteEnumToArray(0x11,value,_i);
  }
  if ((uVar1 & 0x80000) != 0) {
    iVar4 = device_id(this);
    _i = google::protobuf::internal::WireFormatLite::WriteInt32ToArray(0x12,iVar4,_i);
  }
  if ((uVar1 & 0x100000) != 0) {
    bVar2 = test_compute_loss(this);
    _i = google::protobuf::internal::WireFormatLite::WriteBoolToArray(0x13,bVar2,_i);
  }
  if ((uVar1 & 0x2000000) != 0) {
    value_02 = random_seed(this);
    _i = google::protobuf::internal::WireFormatLite::WriteInt64ToArray(0x14,value_02,_i);
  }
  if ((uVar1 & 0x40) != 0) {
    _i = google::protobuf::internal::WireFormatLite::
         InternalWriteMessageNoVirtualToArray<caffe::NetParameter>
                   (0x15,this->train_net_param_,deterministic,_i);
  }
  i_2 = 0;
  uVar5 = test_net_param_size(this);
  for (; i_2 < uVar5; i_2 = i_2 + 1) {
    value_03 = test_net_param(this,i_2);
    _i = google::protobuf::internal::WireFormatLite::
         InternalWriteMessageNoVirtualToArray<caffe::NetParameter>(0x16,value_03,deterministic,_i);
  }
  if ((uVar1 & 0x400000) != 0) {
    bVar2 = debug_info(this);
    _i = google::protobuf::internal::WireFormatLite::WriteBoolToArray(0x17,bVar2,_i);
  }
  if ((uVar1 & 8) != 0) {
    net_abi_cxx11_(this);
    pcVar6 = (char *)std::__cxx11::string::data();
    net_abi_cxx11_(this);
    iVar3 = std::__cxx11::string::length();
    google::protobuf::internal::WireFormat::VerifyUTF8StringNamedField
              (pcVar6,iVar3,SERIALIZE,"caffe.SolverParameter.net");
    psVar7 = net_abi_cxx11_(this);
    _i = google::protobuf::internal::WireFormatLite::WriteStringToArray(0x18,psVar7,_i);
  }
  if ((uVar1 & 0x80) != 0) {
    _i = google::protobuf::internal::WireFormatLite::
         InternalWriteMessageNoVirtualToArray<caffe::NetParameter>
                   (0x19,this->net_param_,deterministic,_i);
  }
  if ((uVar1 & 0x100) != 0) {
    _i = google::protobuf::internal::WireFormatLite::
         InternalWriteMessageNoVirtualToArray<caffe::NetState>
                   (0x1a,this->train_state_,deterministic,_i);
  }
  local_78 = 0;
  uVar5 = test_state_size(this);
  for (; local_78 < uVar5; local_78 = local_78 + 1) {
    value_04 = test_state(this,local_78);
    _i = google::protobuf::internal::WireFormatLite::
         InternalWriteMessageNoVirtualToArray<caffe::NetState>(0x1b,value_04,deterministic,_i);
  }
  if ((uVar1 & 0x10000000) != 0) {
    bVar2 = snapshot_after_train(this);
    _i = google::protobuf::internal::WireFormatLite::WriteBoolToArray(0x1c,bVar2,_i);
  }
  if ((uVar1 & 0x10) != 0) {
    regularization_type_abi_cxx11_(this);
    pcVar6 = (char *)std::__cxx11::string::data();
    regularization_type_abi_cxx11_(this);
    iVar3 = std::__cxx11::string::length();
    google::protobuf::internal::WireFormat::VerifyUTF8StringNamedField
              (pcVar6,iVar3,SERIALIZE,"caffe.SolverParameter.regularization_type");
    psVar7 = regularization_type_abi_cxx11_(this);
    _i = google::protobuf::internal::WireFormatLite::WriteStringToArray(0x1d,psVar7,_i);
  }
  if ((uVar1 & 0x800000) != 0) {
    value_00 = solver_type(this);
    _i = google::protobuf::internal::WireFormatLite::WriteEnumToArray(0x1e,value_00,_i);
  }
  if ((uVar1 & 0x20000000) != 0) {
    fVar8 = delta(this);
    _i = google::protobuf::internal::WireFormatLite::WriteFloatToArray(0x1f,fVar8,_i);
  }
  if ((uVar1 & 0x8000000) != 0) {
    bVar2 = test_initialization(this);
    _i = google::protobuf::internal::WireFormatLite::WriteBoolToArray(0x20,bVar2,_i);
  }
  if ((uVar1 & 0x40000000) != 0) {
    iVar4 = average_loss(this);
    _i = google::protobuf::internal::WireFormatLite::WriteInt32ToArray(0x21,iVar4,_i);
  }
  _i = google::protobuf::internal::WireFormatLite::WriteInt32ToArray(0x22,&this->stepvalue_,_i);
  if ((uVar1 & 0x80000000) != 0) {
    fVar8 = clip_gradients(this);
    _i = google::protobuf::internal::WireFormatLite::WriteFloatToArray(0x23,fVar8,_i);
  }
  uVar1 = (this->_has_bits_).has_bits_[1];
  if ((uVar1 & 1) != 0) {
    iVar4 = iter_size(this);
    _i = google::protobuf::internal::WireFormatLite::WriteInt32ToArray(0x24,iVar4,_i);
  }
  if ((uVar1 & 2) != 0) {
    value_01 = snapshot_format(this);
    _i = google::protobuf::internal::WireFormatLite::WriteEnumToArray(0x25,value_01,_i);
  }
  if ((uVar1 & 4) != 0) {
    fVar8 = rms_decay(this);
    _i = google::protobuf::internal::WireFormatLite::WriteFloatToArray(0x26,fVar8,_i);
  }
  uVar1 = (this->_has_bits_).has_bits_[0];
  if ((uVar1 & 0x1000000) != 0) {
    fVar8 = momentum2(this);
    _i = google::protobuf::internal::WireFormatLite::WriteFloatToArray(0x27,fVar8,_i);
  }
  if ((uVar1 & 0x20) != 0) {
    type_abi_cxx11_(this);
    pcVar6 = (char *)std::__cxx11::string::data();
    type_abi_cxx11_(this);
    iVar3 = std::__cxx11::string::length();
    google::protobuf::internal::WireFormat::VerifyUTF8StringNamedField
              (pcVar6,iVar3,SERIALIZE,"caffe.SolverParameter.type");
    psVar7 = type_abi_cxx11_(this);
    _i = google::protobuf::internal::WireFormatLite::WriteStringToArray(0x28,psVar7,_i);
  }
  if (((uint)(this->_internal_metadata_).
             super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
             .ptr_ & 1) == 1) {
    unknown_fields = SolverParameter::unknown_fields(this);
    _i = google::protobuf::internal::WireFormat::SerializeUnknownFieldsToArray(unknown_fields,_i);
  }
  return _i;
}

Assistant:

::google::protobuf::uint8* SolverParameter::InternalSerializeWithCachedSizesToArray(
    bool deterministic, ::google::protobuf::uint8* target) const {
  // @@protoc_insertion_point(serialize_to_array_start:caffe.SolverParameter)
  ::google::protobuf::uint32 cached_has_bits = 0;
  (void) cached_has_bits;

  cached_has_bits = _has_bits_[0];
  // optional string train_net = 1;
  if (cached_has_bits & 0x00000001u) {
    ::google::protobuf::internal::WireFormat::VerifyUTF8StringNamedField(
      this->train_net().data(), this->train_net().length(),
      ::google::protobuf::internal::WireFormat::SERIALIZE,
      "caffe.SolverParameter.train_net");
    target =
      ::google::protobuf::internal::WireFormatLite::WriteStringToArray(
        1, this->train_net(), target);
  }

  // repeated string test_net = 2;
  for (int i = 0, n = this->test_net_size(); i < n; i++) {
    ::google::protobuf::internal::WireFormat::VerifyUTF8StringNamedField(
      this->test_net(i).data(), this->test_net(i).length(),
      ::google::protobuf::internal::WireFormat::SERIALIZE,
      "caffe.SolverParameter.test_net");
    target = ::google::protobuf::internal::WireFormatLite::
      WriteStringToArray(2, this->test_net(i), target);
  }

  // repeated int32 test_iter = 3;
  target = ::google::protobuf::internal::WireFormatLite::
    WriteInt32ToArray(3, this->test_iter_, target);

  // optional int32 test_interval = 4 [default = 0];
  if (cached_has_bits & 0x00000200u) {
    target = ::google::protobuf::internal::WireFormatLite::WriteInt32ToArray(4, this->test_interval(), target);
  }

  // optional float base_lr = 5;
  if (cached_has_bits & 0x00000400u) {
    target = ::google::protobuf::internal::WireFormatLite::WriteFloatToArray(5, this->base_lr(), target);
  }

  // optional int32 display = 6;
  if (cached_has_bits & 0x00000800u) {
    target = ::google::protobuf::internal::WireFormatLite::WriteInt32ToArray(6, this->display(), target);
  }

  // optional int32 max_iter = 7;
  if (cached_has_bits & 0x00001000u) {
    target = ::google::protobuf::internal::WireFormatLite::WriteInt32ToArray(7, this->max_iter(), target);
  }

  // optional string lr_policy = 8;
  if (cached_has_bits & 0x00000002u) {
    ::google::protobuf::internal::WireFormat::VerifyUTF8StringNamedField(
      this->lr_policy().data(), this->lr_policy().length(),
      ::google::protobuf::internal::WireFormat::SERIALIZE,
      "caffe.SolverParameter.lr_policy");
    target =
      ::google::protobuf::internal::WireFormatLite::WriteStringToArray(
        8, this->lr_policy(), target);
  }

  // optional float gamma = 9;
  if (cached_has_bits & 0x00002000u) {
    target = ::google::protobuf::internal::WireFormatLite::WriteFloatToArray(9, this->gamma(), target);
  }

  // optional float power = 10;
  if (cached_has_bits & 0x00004000u) {
    target = ::google::protobuf::internal::WireFormatLite::WriteFloatToArray(10, this->power(), target);
  }

  // optional float momentum = 11;
  if (cached_has_bits & 0x00008000u) {
    target = ::google::protobuf::internal::WireFormatLite::WriteFloatToArray(11, this->momentum(), target);
  }

  // optional float weight_decay = 12;
  if (cached_has_bits & 0x00010000u) {
    target = ::google::protobuf::internal::WireFormatLite::WriteFloatToArray(12, this->weight_decay(), target);
  }

  // optional int32 stepsize = 13;
  if (cached_has_bits & 0x00020000u) {
    target = ::google::protobuf::internal::WireFormatLite::WriteInt32ToArray(13, this->stepsize(), target);
  }

  // optional int32 snapshot = 14 [default = 0];
  if (cached_has_bits & 0x00040000u) {
    target = ::google::protobuf::internal::WireFormatLite::WriteInt32ToArray(14, this->snapshot(), target);
  }

  // optional string snapshot_prefix = 15;
  if (cached_has_bits & 0x00000004u) {
    ::google::protobuf::internal::WireFormat::VerifyUTF8StringNamedField(
      this->snapshot_prefix().data(), this->snapshot_prefix().length(),
      ::google::protobuf::internal::WireFormat::SERIALIZE,
      "caffe.SolverParameter.snapshot_prefix");
    target =
      ::google::protobuf::internal::WireFormatLite::WriteStringToArray(
        15, this->snapshot_prefix(), target);
  }

  // optional bool snapshot_diff = 16 [default = false];
  if (cached_has_bits & 0x00200000u) {
    target = ::google::protobuf::internal::WireFormatLite::WriteBoolToArray(16, this->snapshot_diff(), target);
  }

  // optional .caffe.SolverParameter.SolverMode solver_mode = 17 [default = GPU];
  if (cached_has_bits & 0x04000000u) {
    target = ::google::protobuf::internal::WireFormatLite::WriteEnumToArray(
      17, this->solver_mode(), target);
  }

  // optional int32 device_id = 18 [default = 0];
  if (cached_has_bits & 0x00080000u) {
    target = ::google::protobuf::internal::WireFormatLite::WriteInt32ToArray(18, this->device_id(), target);
  }

  // optional bool test_compute_loss = 19 [default = false];
  if (cached_has_bits & 0x00100000u) {
    target = ::google::protobuf::internal::WireFormatLite::WriteBoolToArray(19, this->test_compute_loss(), target);
  }

  // optional int64 random_seed = 20 [default = -1];
  if (cached_has_bits & 0x02000000u) {
    target = ::google::protobuf::internal::WireFormatLite::WriteInt64ToArray(20, this->random_seed(), target);
  }

  // optional .caffe.NetParameter train_net_param = 21;
  if (cached_has_bits & 0x00000040u) {
    target = ::google::protobuf::internal::WireFormatLite::
      InternalWriteMessageNoVirtualToArray(
        21, *this->train_net_param_, deterministic, target);
  }

  // repeated .caffe.NetParameter test_net_param = 22;
  for (unsigned int i = 0, n = this->test_net_param_size(); i < n; i++) {
    target = ::google::protobuf::internal::WireFormatLite::
      InternalWriteMessageNoVirtualToArray(
        22, this->test_net_param(i), deterministic, target);
  }

  // optional bool debug_info = 23 [default = false];
  if (cached_has_bits & 0x00400000u) {
    target = ::google::protobuf::internal::WireFormatLite::WriteBoolToArray(23, this->debug_info(), target);
  }

  // optional string net = 24;
  if (cached_has_bits & 0x00000008u) {
    ::google::protobuf::internal::WireFormat::VerifyUTF8StringNamedField(
      this->net().data(), this->net().length(),
      ::google::protobuf::internal::WireFormat::SERIALIZE,
      "caffe.SolverParameter.net");
    target =
      ::google::protobuf::internal::WireFormatLite::WriteStringToArray(
        24, this->net(), target);
  }

  // optional .caffe.NetParameter net_param = 25;
  if (cached_has_bits & 0x00000080u) {
    target = ::google::protobuf::internal::WireFormatLite::
      InternalWriteMessageNoVirtualToArray(
        25, *this->net_param_, deterministic, target);
  }

  // optional .caffe.NetState train_state = 26;
  if (cached_has_bits & 0x00000100u) {
    target = ::google::protobuf::internal::WireFormatLite::
      InternalWriteMessageNoVirtualToArray(
        26, *this->train_state_, deterministic, target);
  }

  // repeated .caffe.NetState test_state = 27;
  for (unsigned int i = 0, n = this->test_state_size(); i < n; i++) {
    target = ::google::protobuf::internal::WireFormatLite::
      InternalWriteMessageNoVirtualToArray(
        27, this->test_state(i), deterministic, target);
  }

  // optional bool snapshot_after_train = 28 [default = true];
  if (cached_has_bits & 0x10000000u) {
    target = ::google::protobuf::internal::WireFormatLite::WriteBoolToArray(28, this->snapshot_after_train(), target);
  }

  // optional string regularization_type = 29 [default = "L2"];
  if (cached_has_bits & 0x00000010u) {
    ::google::protobuf::internal::WireFormat::VerifyUTF8StringNamedField(
      this->regularization_type().data(), this->regularization_type().length(),
      ::google::protobuf::internal::WireFormat::SERIALIZE,
      "caffe.SolverParameter.regularization_type");
    target =
      ::google::protobuf::internal::WireFormatLite::WriteStringToArray(
        29, this->regularization_type(), target);
  }

  // optional .caffe.SolverParameter.SolverType solver_type = 30 [default = SGD];
  if (cached_has_bits & 0x00800000u) {
    target = ::google::protobuf::internal::WireFormatLite::WriteEnumToArray(
      30, this->solver_type(), target);
  }

  // optional float delta = 31 [default = 1e-08];
  if (cached_has_bits & 0x20000000u) {
    target = ::google::protobuf::internal::WireFormatLite::WriteFloatToArray(31, this->delta(), target);
  }

  // optional bool test_initialization = 32 [default = true];
  if (cached_has_bits & 0x08000000u) {
    target = ::google::protobuf::internal::WireFormatLite::WriteBoolToArray(32, this->test_initialization(), target);
  }

  // optional int32 average_loss = 33 [default = 1];
  if (cached_has_bits & 0x40000000u) {
    target = ::google::protobuf::internal::WireFormatLite::WriteInt32ToArray(33, this->average_loss(), target);
  }

  // repeated int32 stepvalue = 34;
  target = ::google::protobuf::internal::WireFormatLite::
    WriteInt32ToArray(34, this->stepvalue_, target);

  // optional float clip_gradients = 35 [default = -1];
  if (cached_has_bits & 0x80000000u) {
    target = ::google::protobuf::internal::WireFormatLite::WriteFloatToArray(35, this->clip_gradients(), target);
  }

  cached_has_bits = _has_bits_[1];
  // optional int32 iter_size = 36 [default = 1];
  if (cached_has_bits & 0x00000001u) {
    target = ::google::protobuf::internal::WireFormatLite::WriteInt32ToArray(36, this->iter_size(), target);
  }

  // optional .caffe.SolverParameter.SnapshotFormat snapshot_format = 37 [default = BINARYPROTO];
  if (cached_has_bits & 0x00000002u) {
    target = ::google::protobuf::internal::WireFormatLite::WriteEnumToArray(
      37, this->snapshot_format(), target);
  }

  // optional float rms_decay = 38 [default = 0.99];
  if (cached_has_bits & 0x00000004u) {
    target = ::google::protobuf::internal::WireFormatLite::WriteFloatToArray(38, this->rms_decay(), target);
  }

  cached_has_bits = _has_bits_[0];
  // optional float momentum2 = 39 [default = 0.999];
  if (cached_has_bits & 0x01000000u) {
    target = ::google::protobuf::internal::WireFormatLite::WriteFloatToArray(39, this->momentum2(), target);
  }

  // optional string type = 40 [default = "SGD"];
  if (cached_has_bits & 0x00000020u) {
    ::google::protobuf::internal::WireFormat::VerifyUTF8StringNamedField(
      this->type().data(), this->type().length(),
      ::google::protobuf::internal::WireFormat::SERIALIZE,
      "caffe.SolverParameter.type");
    target =
      ::google::protobuf::internal::WireFormatLite::WriteStringToArray(
        40, this->type(), target);
  }

  if (_internal_metadata_.have_unknown_fields()) {
    target = ::google::protobuf::internal::WireFormat::SerializeUnknownFieldsToArray(
        unknown_fields(), target);
  }
  // @@protoc_insertion_point(serialize_to_array_end:caffe.SolverParameter)
  return target;
}